

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectsource.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::ProtoStreamObjectSource::RenderFloat
          (Status *__return_storage_ptr__,ProtoStreamObjectSource *this,ProtoStreamObjectSource *os,
          Type *type,StringPiece field_name,ObjectWriter *ow)

{
  CodedInputStream *pCVar1;
  byte *pbVar2;
  uint32 uVar3;
  uint32 local_34 [2];
  uint32 buffer32;
  
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  if (pbVar2 < pCVar1->buffer_end_) {
    uVar3 = (uint32)*pbVar2;
    if ((char)*pbVar2 < '\0') goto LAB_00334e41;
    pCVar1->buffer_ = pbVar2 + 1;
  }
  else {
    uVar3 = 0;
LAB_00334e41:
    uVar3 = io::CodedInputStream::ReadTagFallback(pCVar1,uVar3);
  }
  pCVar1->last_tag_ = uVar3;
  local_34[0] = 0;
  if (uVar3 == 0) goto LAB_00334e9a;
  io::CodedInputStream::ReadLittleEndian32(this->stream_,local_34);
  pCVar1 = this->stream_;
  pbVar2 = pCVar1->buffer_;
  if (pbVar2 < pCVar1->buffer_end_) {
    uVar3 = (uint32)*pbVar2;
    if ((char)*pbVar2 < '\0') goto LAB_00334e87;
    pCVar1->buffer_ = pbVar2 + 1;
  }
  else {
    uVar3 = 0;
LAB_00334e87:
    uVar3 = io::CodedInputStream::ReadTagFallback(pCVar1,uVar3);
  }
  pCVar1->last_tag_ = uVar3;
LAB_00334e9a:
  (**(code **)(*(long *)field_name.length_ + 0x60))
            (local_34[0],(long *)field_name.length_,type,field_name.ptr_);
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Status ProtoStreamObjectSource::RenderFloat(const ProtoStreamObjectSource* os,
                                            const google::protobuf::Type& type,
                                            StringPiece field_name,
                                            ObjectWriter* ow) {
  uint32 tag = os->stream_->ReadTag();
  uint32 buffer32 = 0;  // default value of Float wrapper value
  if (tag != 0) {
    os->stream_->ReadLittleEndian32(&buffer32);
    os->stream_->ReadTag();
  }
  ow->RenderFloat(field_name, bit_cast<float>(buffer32));
  return util::Status();
}